

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

void StoreSideInfo(VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  VP8MBInfo *pVVar2;
  WebPPicture *pWVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  VP8Encoder *enc;
  
  pVVar1 = it->enc_;
  pVVar2 = it->mb_;
  pWVar3 = pVVar1->pic_;
  if (pWVar3->stats != (WebPAuxStats *)0x0) {
    puVar4 = it->yuv_in_;
    puVar5 = it->yuv_out_;
    iVar6 = (*VP8SSE16x16)(puVar4,puVar5);
    pVVar1->sse_[0] = pVVar1->sse_[0] + (long)iVar6;
    iVar6 = (*VP8SSE8x8)(puVar4 + 0x10,puVar5 + 0x10);
    pVVar1->sse_[1] = pVVar1->sse_[1] + (long)iVar6;
    iVar6 = (*VP8SSE8x8)(puVar4 + 0x18,puVar5 + 0x18);
    pVVar1->sse_[2] = pVVar1->sse_[2] + (long)iVar6;
    pVVar1->sse_count_ = pVVar1->sse_count_ + 0x100;
    pVVar1->block_count_[0] = pVVar1->block_count_[0] + (uint)(((uint)*pVVar2 & 3) == 0);
    pVVar1->block_count_[1] = pVVar1->block_count_[1] + (uint)(((uint)*pVVar2 & 3) == 1);
    pVVar1->block_count_[2] = pVVar1->block_count_[2] + (uint)(((uint)*pVVar2 >> 4 & 1) != 0);
  }
  if (pWVar3->extra_info == (uint8_t *)0x0) {
    return;
  }
  switch(pWVar3->extra_info_type) {
  case 1:
    bVar7 = *(byte *)pVVar2;
    goto LAB_00138d8f;
  case 2:
    bVar7 = *(byte *)pVVar2 >> 5;
    goto LAB_00138d8f;
  case 3:
    bVar7 = (byte)pVVar1->dqm_[*(byte *)pVVar2 >> 5 & 3].quant_;
    break;
  case 4:
    bVar7 = 0xff;
    if (((uint)*pVVar2 & 3) == 1) {
      bVar7 = *it->preds_;
    }
    break;
  case 5:
    bVar7 = *(byte *)pVVar2 >> 2;
LAB_00138d8f:
    bVar7 = bVar7 & 3;
    break;
  case 6:
    uVar8 = it->uv_bits_ + it->luma_bits_ + 7 >> 3;
    bVar7 = 0xff;
    if ((int)uVar8 < 0xff) {
      bVar7 = (byte)uVar8;
    }
    break;
  case 7:
    bVar7 = pVVar2->alpha_;
    break;
  default:
    bVar7 = 0;
  }
  pWVar3->extra_info[(long)pVVar1->mb_w_ * (long)it->y_ + (long)it->x_] = bVar7;
  return;
}

Assistant:

static void StoreSideInfo(const VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
  const VP8MBInfo* const mb = it->mb_;
  WebPPicture* const pic = enc->pic_;

  if (pic->stats != NULL) {
    StoreSSE(it);
    enc->block_count_[0] += (mb->type_ == 0);
    enc->block_count_[1] += (mb->type_ == 1);
    enc->block_count_[2] += (mb->skip_ != 0);
  }

  if (pic->extra_info != NULL) {
    uint8_t* const info = &pic->extra_info[it->x_ + it->y_ * enc->mb_w_];
    switch (pic->extra_info_type) {
      case 1: *info = mb->type_; break;
      case 2: *info = mb->segment_; break;
      case 3: *info = enc->dqm_[mb->segment_].quant_; break;
      case 4: *info = (mb->type_ == 1) ? it->preds_[0] : 0xff; break;
      case 5: *info = mb->uv_mode_; break;
      case 6: {
        const int b = (int)((it->luma_bits_ + it->uv_bits_ + 7) >> 3);
        *info = (b > 255) ? 255 : b; break;
      }
      case 7: *info = mb->alpha_; break;
      default: *info = 0; break;
    }
  }
#if SEGMENT_VISU  // visualize segments and prediction modes
  SetBlock(it->yuv_out_ + Y_OFF_ENC, mb->segment_ * 64, 16);
  SetBlock(it->yuv_out_ + U_OFF_ENC, it->preds_[0] * 64, 8);
  SetBlock(it->yuv_out_ + V_OFF_ENC, mb->uv_mode_ * 64, 8);
#endif
}